

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int callback_cancel(uint id)

{
  int in_EDI;
  int pi;
  callback_t *p;
  callback_t *__ptr;
  
  __ptr = gCallBackFirst;
  while( true ) {
    if (__ptr == (callback_t *)0x0) {
      return -0x7da;
    }
    if (__ptr->id == in_EDI) break;
    __ptr = __ptr->next;
  }
  if (__ptr->prev == (callback_t *)0x0) {
    gCallBackFirst = __ptr->next;
  }
  else {
    __ptr->prev->next = __ptr->next;
  }
  if (__ptr->next == (callback_t *)0x0) {
    gCallBackLast = __ptr->prev;
  }
  else {
    __ptr->next->prev = __ptr->prev;
  }
  free(__ptr);
  findNotifyBits((int)((ulong)__ptr >> 0x20));
  return 0;
}

Assistant:

int callback_cancel(unsigned id)
{
   callback_t *p;
   int pi;

   p = gCallBackFirst;

   while (p)
   {
      if (p->id == id)
      {
         pi = p->pi;

         if (p->prev) {p->prev->next = p->next;}
         else         {gCallBackFirst = p->next;}

         if (p->next) {p->next->prev = p->prev;}
         else         {gCallBackLast = p->prev;}

         free(p);

         findNotifyBits(pi);

         return 0;
      }
      p = p->next;
   }
   return pigif_callback_not_found;
}